

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

bool operator==(TargetDependsClosureKey *lhs,TargetDependsClosureKey *rhs)

{
  __type _Var1;
  bool local_19;
  TargetDependsClosureKey *rhs_local;
  TargetDependsClosureKey *lhs_local;
  
  local_19 = false;
  if (lhs->Target == rhs->Target) {
    _Var1 = std::operator==(&lhs->Config,&rhs->Config);
    local_19 = false;
    if (_Var1) {
      local_19 = (lhs->GenexOutput & 1U) == (rhs->GenexOutput & 1U);
    }
  }
  return local_19;
}

Assistant:

bool operator==(
  const cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey& lhs,
  const cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey& rhs)
{
  return lhs.Target == rhs.Target && lhs.Config == rhs.Config &&
    lhs.GenexOutput == rhs.GenexOutput;
}